

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39> __thiscall
mp::BasicExprFactory<std::allocator<char>>::
MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
          (BasicExprFactory<std::allocator<char>> *this,LogicalExpr condition,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> then_expr,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> else_expr)

{
  Impl *impl;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39> BVar1;
  AssertionFailure *this_00;
  
  if ((condition.super_ExprBase.impl_ != (Impl *)0x0) &&
     (then_expr.super_ExprBase.impl_ != (Impl *)0x0)) {
    impl = Allocate<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
                     (this,IF,0);
    impl->condition = (Impl *)condition.super_ExprBase.impl_;
    impl->then_expr = (Impl *)then_expr.super_ExprBase.impl_;
    impl->else_expr = (Impl *)else_expr.super_ExprBase.impl_;
    BVar1 = internal::ExprBase::
            Create<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
                      (&impl->super_Impl);
    return (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
           BVar1.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_;
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"invalid argument");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

operator SafeBool() const { return impl_ != 0 ? &ExprBase::True : 0; }